

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

bool __thiscall google::protobuf::internal::ExtensionSet::Extension::IsInitialized(Extension *this)

{
  CppType CVar1;
  int iVar2;
  uint uVar3;
  MessageLite *pMVar4;
  ulong uVar5;
  RepeatedPtrField<google::protobuf::MessageLite> *in_RDI;
  int i;
  int index;
  int local_14;
  
  CVar1 = anon_unknown_19::cpp_type('\0');
  if (CVar1 == CPPTYPE_MESSAGE) {
    if (((in_RDI->super_RepeatedPtrFieldBase).current_size_ & 0x100) == 0) {
      if (((in_RDI->super_RepeatedPtrFieldBase).current_size_ & 0x10000) == 0) {
        if ((*(byte *)((long)&(in_RDI->super_RepeatedPtrFieldBase).current_size_ + 2) >> 4 & 1) == 0
           ) {
          uVar5 = (*(code *)((((in_RDI->super_RepeatedPtrFieldBase).arena_)->impl_).threads_._M_b.
                            _M_p)->cleanup_limit_)();
          if ((uVar5 & 1) == 0) {
            return false;
          }
        }
        else {
          uVar5 = (*(code *)(((in_RDI->super_RepeatedPtrFieldBase).arena_)->impl_).threads_._M_b.
                            _M_p[1].arena_)();
          if ((uVar5 & 1) == 0) {
            return false;
          }
        }
      }
    }
    else {
      local_14 = 0;
      while (index = local_14,
            iVar2 = RepeatedPtrField<google::protobuf::MessageLite>::size
                              ((RepeatedPtrField<google::protobuf::MessageLite> *)0x498afd),
            index < iVar2) {
        pMVar4 = RepeatedPtrField<google::protobuf::MessageLite>::Get(in_RDI,index);
        uVar3 = (*pMVar4->_vptr_MessageLite[8])();
        if ((uVar3 & 1) == 0) {
          return false;
        }
        local_14 = local_14 + 1;
      }
    }
  }
  return true;
}

Assistant:

bool ExtensionSet::Extension::IsInitialized() const {
  if (cpp_type(type) == WireFormatLite::CPPTYPE_MESSAGE) {
    if (is_repeated) {
      for (int i = 0; i < repeated_message_value->size(); i++) {
        if (!repeated_message_value->Get(i).IsInitialized()) {
          return false;
        }
      }
    } else {
      if (!is_cleared) {
        if (is_lazy) {
          if (!lazymessage_value->IsInitialized()) return false;
        } else {
          if (!message_value->IsInitialized()) return false;
        }
      }
    }
  }
  return true;
}